

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O2

exr_result_t
internal_exr_alloc_context
          (exr_context_t *out,exr_context_initializer_t *initializers,
          _INTERNAL_EXR_CONTEXT_MODE mode,size_t default_size)

{
  uint uVar1;
  exr_error_handler_cb_t p_Var2;
  exr_memory_allocation_func_t p_Var3;
  int iVar4;
  exr_result_t eVar5;
  exr_context_t f;
  exr_context_t p_Var6;
  char *pcVar7;
  int iVar8;
  size_t sVar9;
  int gmaxh;
  int gmaxw;
  exr_priv_part_t part;
  
  *out = (exr_context_t)0x0;
  if (initializers->read_fn == (exr_read_func_ptr_t)0x0) {
    sVar9 = 0;
    if (initializers->write_fn == (exr_write_func_ptr_t)0x0) {
      sVar9 = default_size;
    }
  }
  else {
    sVar9 = 0;
  }
  f = (exr_context_t)(*initializers->alloc_fn)(sVar9 + 0x228);
  if (f == (exr_context_t)0x0) {
    p_Var2 = initializers->error_handler_fn;
    pcVar7 = exr_get_default_error_message(1);
    (*p_Var2)((exr_const_context_t)0x0,1,pcVar7);
    return 1;
  }
  memset(&f->version,0,0x227);
  f->mode = (uint8_t)mode;
  p_Var6 = (exr_context_t)initializers->user_data;
  f->real_user_data = p_Var6;
  if ((initializers->read_fn == (exr_read_func_ptr_t)0x0) &&
     (initializers->write_fn == (exr_write_func_ptr_t)0x0)) {
    if (sVar9 == 0) goto LAB_0011469a;
    p_Var6 = f + 1;
  }
  f->user_data = p_Var6;
LAB_0011469a:
  f->standard_error = dispatch_standard_error;
  f->report_error = dispatch_error;
  f->print_error = dispatch_print_error;
  p_Var3 = initializers->alloc_fn;
  f->error_handler_fn = initializers->error_handler_fn;
  f->alloc_fn = p_Var3;
  f->free_fn = initializers->free_fn;
  exr_get_default_maximum_image_size(&gmaxw,&gmaxh);
  iVar4 = initializers->max_image_width;
  if (initializers->max_image_width < 1) {
    iVar4 = gmaxw;
  }
  iVar8 = gmaxw;
  if (iVar4 <= gmaxw || gmaxw < 1) {
    iVar8 = iVar4;
  }
  if (iVar4 < 1) {
    iVar8 = iVar4;
  }
  f->max_image_w = iVar8;
  iVar4 = initializers->max_image_height;
  if (initializers->max_image_height < 1) {
    iVar4 = gmaxh;
  }
  iVar8 = gmaxh;
  if (iVar4 <= gmaxh || gmaxh < 1) {
    iVar8 = iVar4;
  }
  if (iVar4 < 1) {
    iVar8 = iVar4;
  }
  f->max_image_h = iVar8;
  exr_get_default_maximum_tile_size(&gmaxw,&gmaxh);
  iVar4 = initializers->max_tile_width;
  if (initializers->max_tile_width < 1) {
    iVar4 = gmaxw;
  }
  if (iVar4 <= gmaxw || gmaxw < 1) {
    gmaxw = iVar4;
  }
  if (iVar4 < 1) {
    gmaxw = iVar4;
  }
  f->max_tile_w = gmaxw;
  iVar4 = initializers->max_tile_height;
  if (initializers->max_tile_height < 1) {
    iVar4 = gmaxh;
  }
  if (iVar4 <= gmaxh || gmaxh < 1) {
    gmaxh = iVar4;
  }
  if (iVar4 < 1) {
    gmaxh = iVar4;
  }
  f->max_tile_h = gmaxh;
  exr_get_default_zip_compression_level(&f->default_zip_level);
  exr_get_default_dwa_compression_quality(&f->default_dwa_quality);
  if (-1 < initializers->zip_level) {
    f->default_zip_level = initializers->zip_level;
  }
  if (0.0 <= initializers->dwa_quality) {
    f->default_dwa_quality = initializers->dwa_quality;
  }
  uVar1 = initializers->flags;
  if ((uVar1 & 1) != 0) {
    f->strict_header = '\x01';
  }
  if ((uVar1 & 2) != 0) {
    f->silent_header = '\x01';
  }
  f->disable_chunk_reconstruct = (byte)uVar1 & 4;
  f->legacy_header = (byte)uVar1 & 8;
  f->file_size = -1;
  f->max_name_length = '\x1f';
  f->destroy_fn = initializers->destroy_fn;
  f->read_fn = initializers->read_fn;
  f->write_fn = initializers->write_fn;
  eVar5 = 0;
  iVar4 = pthread_mutex_init((pthread_mutex_t *)&f->mutex,(pthread_mutexattr_t *)0x0);
  if (iVar4 == 0) {
    *out = f;
    if ((mode != EXR_CONTEXT_WRITE) &&
       (eVar5 = internal_exr_add_part(f,&part,(int *)0x0), eVar5 != 0)) {
      (*initializers->free_fn)(f);
      *out = (exr_context_t)0x0;
    }
  }
  else {
    (*initializers->free_fn)(f);
    *out = (exr_context_t)0x0;
    eVar5 = 1;
  }
  return eVar5;
}

Assistant:

exr_result_t
internal_exr_alloc_context (
    exr_context_t*                   out,
    const exr_context_initializer_t* initializers,
    enum _INTERNAL_EXR_CONTEXT_MODE  mode,
    size_t                           default_size)
{
    void*         memptr;
    exr_result_t  rv;
    exr_context_t ret;
    int           gmaxw, gmaxh;
    size_t        extra_data;

    *out = NULL;
    if (initializers->read_fn || initializers->write_fn)
        extra_data = 0;
    else
        extra_data = default_size;

    memptr = (initializers->alloc_fn) (
        sizeof (struct _priv_exr_context_t) + extra_data);
    if (memptr)
    {
        memset (memptr, 0, sizeof (struct _priv_exr_context_t));

        ret       = memptr;
        ret->mode = (uint8_t) mode;
        /* stash this separately so when a user queries they don't see
         * any of our internal hijinx */
        ret->real_user_data = initializers->user_data;
        if (initializers->read_fn || initializers->write_fn)
            ret->user_data = initializers->user_data;
        else if (extra_data > 0)
            ret->user_data =
                (((uint8_t*) memptr) + sizeof (struct _priv_exr_context_t));

        ret->standard_error   = &dispatch_standard_error;
        ret->report_error     = &dispatch_error;
        ret->print_error      = &dispatch_print_error;
        ret->error_handler_fn = initializers->error_handler_fn;
        ret->alloc_fn         = initializers->alloc_fn;
        ret->free_fn          = initializers->free_fn;

        exr_get_default_maximum_image_size (&gmaxw, &gmaxh);
        if (initializers->max_image_width <= 0)
            ret->max_image_w = gmaxw;
        else
            ret->max_image_w = initializers->max_image_width;
        if (ret->max_image_w > 0 && gmaxw > 0 && ret->max_image_w &&
            ret->max_image_w > gmaxw)
            ret->max_image_w = gmaxw;

        if (initializers->max_image_height <= 0)
            ret->max_image_h = gmaxh;
        else
            ret->max_image_h = initializers->max_image_height;
        if (ret->max_image_h > 0 && gmaxh > 0 && ret->max_image_h &&
            ret->max_image_h > gmaxh)
            ret->max_image_h = gmaxh;

        exr_get_default_maximum_tile_size (&gmaxw, &gmaxh);
        if (initializers->max_tile_width <= 0)
            ret->max_tile_w = gmaxw;
        else
            ret->max_tile_w = initializers->max_tile_width;
        if (ret->max_tile_w > 0 && gmaxw > 0 && ret->max_tile_w &&
            ret->max_tile_w > gmaxw)
            ret->max_tile_w = gmaxw;

        if (initializers->max_tile_height <= 0)
            ret->max_tile_h = gmaxh;
        else
            ret->max_tile_h = initializers->max_tile_height;
        if (ret->max_tile_h > 0 && gmaxh > 0 && ret->max_tile_h &&
            ret->max_tile_h > gmaxh)
            ret->max_tile_h = gmaxh;

        exr_get_default_zip_compression_level (&ret->default_zip_level);
        exr_get_default_dwa_compression_quality (&ret->default_dwa_quality);
        if (initializers->zip_level >= 0)
            ret->default_zip_level = initializers->zip_level;
        if (initializers->dwa_quality >= 0.f)
            ret->default_dwa_quality = initializers->dwa_quality;

        if (initializers->flags & EXR_CONTEXT_FLAG_STRICT_HEADER)
            ret->strict_header = 1;
        if (initializers->flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE)
            ret->silent_header = 1;
        ret->disable_chunk_reconstruct =
            (initializers->flags &
             EXR_CONTEXT_FLAG_DISABLE_CHUNK_RECONSTRUCTION);
        ret->legacy_header =
            (initializers->flags & EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER);

        ret->file_size       = -1;
        ret->max_name_length = EXR_SHORTNAME_MAXLEN;

        ret->destroy_fn = initializers->destroy_fn;
        ret->read_fn    = initializers->read_fn;
        ret->write_fn   = initializers->write_fn;

#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
        InitializeCriticalSection (&(ret->mutex));
#    else
        rv = pthread_mutex_init (&(ret->mutex), NULL);
        if (rv != 0)
        {
            /* fairly unlikely... */
            (initializers->free_fn) (memptr);
            *out = NULL;
            return EXR_ERR_OUT_OF_MEMORY;
        }
#    endif
#endif

        *out = ret;
        rv   = EXR_ERR_SUCCESS;

        /* if we are reading the file, go ahead and set up the first
         * part to make parsing logic easier */
        if (mode != EXR_CONTEXT_WRITE)
        {
            exr_priv_part_t part;
            rv = internal_exr_add_part (ret, &part, NULL);
            if (rv != EXR_ERR_SUCCESS)
            {
                /* this should never happen since we reserve space for
                 * one in the struct, but maybe we changed
                 * something */
                (initializers->free_fn) (memptr);
                *out = NULL;
            }
        }
    }
    else
    {
        (initializers->error_handler_fn) (
            NULL,
            EXR_ERR_OUT_OF_MEMORY,
            exr_get_default_error_message (EXR_ERR_OUT_OF_MEMORY));
        rv = EXR_ERR_OUT_OF_MEMORY;
    }

    return rv;
}